

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O2

void __thiscall
Disa::Vector_Dense<double,_2UL>::Vector_Dense
          (Vector_Dense<double,_2UL> *this,initializer_list<double> *list)

{
  iterator pdVar1;
  ostream *poVar2;
  source_location *in_RCX;
  initializer_list<double> *__range2;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (list->_M_len == 2) {
    pdVar1 = list->_M_array;
    (this->super_array<double,_2UL>)._M_elems[0] = *pdVar1;
    (this->super_array<double,_2UL>)._M_elems[1] = pdVar1[1];
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
  local_40 = &PTR_s__workspace_llm4binary_github_lic_001548c8;
  console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,in_RCX);
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  std::__cxx11::to_string(&local_e0,list->_M_len);
  std::operator+(&local_c0,"Initializer list of incorrect size, ",&local_e0);
  std::operator+(&local_a0,&local_c0," vs. ");
  std::__cxx11::to_string(&local_100,2);
  std::operator+(&local_80,&local_a0,&local_100);
  std::operator+(&local_60,&local_80,".");
  poVar2 = std::operator<<(poVar2,(string *)&local_60);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_38);
  exit(1);
}

Assistant:

Vector_Dense(const std::initializer_list<_type>& list) {
    ASSERT_DEBUG(list.size() == _size, "Initializer list of incorrect size, " + std::to_string(list.size()) + " vs. " +
                                       std::to_string(_size) + ".");
    auto iter = this->begin();
    FOR_EACH(item, list)* iter++ = item;
  }